

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O0

int CVodeGetSens(void *cvode_mem,sunrealtype *tret,N_Vector *ySout)

{
  sunrealtype in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  int flag;
  CVodeMem cv_mem;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_4;
  
  if (in_RDI == 0) {
    cvProcessError((CVodeMem)0x0,-0x15,0xf7c,"CVodeGetSens",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    *in_RSI = *(undefined8 *)(in_RDI + 0x410);
    local_4 = CVodeGetSensDky(in_RSI,in_RDX,(int)((ulong)in_RDI >> 0x20),
                              (N_Vector *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  return local_4;
}

Assistant:

int CVodeGetSens(void* cvode_mem, sunrealtype* tret, N_Vector* ySout)
{
  CVodeMem cv_mem;
  int flag;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(CV_PROFILER);

  *tret = cv_mem->cv_tretlast;

  flag = CVodeGetSensDky(cvode_mem, cv_mem->cv_tretlast, 0, ySout);

  SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
  return (flag);
}